

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O3

void __thiscall Am_Inter_Location::Install(Am_Inter_Location *this,Am_Object *object,bool growing)

{
  Am_Location_Value_Control AVar1;
  bool bVar2;
  Am_Slot_Key key;
  Am_Value *pAVar3;
  Am_Inter_Location_Data *pAVar4;
  int c;
  int b;
  int a;
  int d;
  Am_Object owner;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Am_Object local_20;
  
  if (this->data == (Am_Inter_Location_Data *)0x0) {
    Am_Error("Am_Inter_Location not initialized");
  }
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)object,10);
  pAVar4 = this->data;
  local_28 = (pAVar4->data).rect.left;
  local_2c = (pAVar4->data).rect.top;
  local_30 = (pAVar4->data).rect.width;
  local_24 = (pAVar4->data).rect.height;
  bVar2 = Am_Object::Valid(&pAVar4->ref_obj);
  pAVar4 = this->data;
  if (bVar2) {
    bVar2 = Am_Object::operator!=(&local_20,&pAVar4->ref_obj);
    pAVar4 = this->data;
    if (bVar2) {
      Am_Translate_Coordinates(&pAVar4->ref_obj,local_28,local_2c,&local_20,&local_28,&local_2c);
      pAVar4 = this->data;
      if (pAVar4->as_line == true) {
        Am_Translate_Coordinates(&pAVar4->ref_obj,local_30,local_24,&local_20,&local_30,&local_24);
        pAVar4 = this->data;
      }
    }
  }
  if (pAVar4->as_line == true) {
    if (pAVar4->a_control == Am_LOCATION_RELATIVE) {
      pAVar3 = Am_Object::Get(object,0x8b,0);
      local_28 = Am_Value::operator_cast_to_int(pAVar3);
      pAVar4 = this->data;
      local_28 = local_28 + (pAVar4->data).rect.left;
    }
    if (pAVar4->b_control == Am_LOCATION_RELATIVE) {
      pAVar3 = Am_Object::Get(object,0x8c,0);
      local_2c = Am_Value::operator_cast_to_int(pAVar3);
      pAVar4 = this->data;
      local_2c = local_2c + (pAVar4->data).rect.top;
    }
    if (pAVar4->c_control == Am_LOCATION_RELATIVE) {
      pAVar3 = Am_Object::Get(object,0x8d,0);
      local_30 = Am_Value::operator_cast_to_int(pAVar3);
      pAVar4 = this->data;
      local_30 = local_30 + (pAVar4->data).rect.width;
    }
    if (pAVar4->d_control == Am_LOCATION_RELATIVE) {
      pAVar3 = Am_Object::Get(object,0x8e,0);
      local_24 = Am_Value::operator_cast_to_int(pAVar3);
      pAVar4 = this->data;
      local_24 = local_24 + (pAVar4->data).rect.height;
    }
    if (pAVar4->a_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,0x8b,local_28,0);
      pAVar4 = this->data;
    }
    if (pAVar4->b_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,0x8c,local_2c,0);
      pAVar4 = this->data;
    }
    if (pAVar4->c_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,0x8d,local_30,0);
      pAVar4 = this->data;
    }
    key = 0x8e;
    AVar1 = pAVar4->d_control;
  }
  else {
    if (pAVar4->a_control == Am_LOCATION_RELATIVE) {
      pAVar3 = Am_Object::Get(object,100,0);
      local_28 = Am_Value::operator_cast_to_int(pAVar3);
      pAVar4 = this->data;
      local_28 = local_28 + (pAVar4->data).rect.left;
    }
    if (pAVar4->b_control == Am_LOCATION_RELATIVE) {
      pAVar3 = Am_Object::Get(object,0x65,0);
      local_2c = Am_Value::operator_cast_to_int(pAVar3);
      pAVar4 = this->data;
      local_2c = local_2c + (pAVar4->data).rect.top;
    }
    if (pAVar4->a_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,100,local_28,0);
      pAVar4 = this->data;
    }
    if (pAVar4->b_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,0x65,local_2c,0);
    }
    if (!growing) goto LAB_001b5a5f;
    pAVar4 = this->data;
    if (pAVar4->c_control == Am_LOCATION_RELATIVE) {
      pAVar3 = Am_Object::Get(object,0x66,0);
      local_30 = Am_Value::operator_cast_to_int(pAVar3);
      pAVar4 = this->data;
      local_30 = local_30 + (pAVar4->data).rect.width;
    }
    if (pAVar4->d_control == Am_LOCATION_RELATIVE) {
      pAVar3 = Am_Object::Get(object,0x67,0);
      local_24 = Am_Value::operator_cast_to_int(pAVar3);
      pAVar4 = this->data;
      local_24 = local_24 + (pAVar4->data).rect.height;
    }
    if (pAVar4->c_control != Am_LOCATION_NOT_USED) {
      Am_Object::Set(object,0x66,local_30,0);
      pAVar4 = this->data;
    }
    key = 0x67;
    AVar1 = pAVar4->d_control;
  }
  if (AVar1 != Am_LOCATION_NOT_USED) {
    Am_Object::Set(object,key,local_24,0);
  }
LAB_001b5a5f:
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

void
Am_Inter_Location::Install(Am_Object &object, bool growing) const
{
  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  Am_Object owner = object.Get_Owner();
  int a = data->data.line.x1;
  int b = data->data.line.y1;
  int c = data->data.line.x2;
  int d = data->data.line.y2;

  if (data->ref_obj.Valid() && owner != data->ref_obj) {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                         "Translating set coordinates from "
                             << data->ref_obj << " to " << owner);
    Am_Translate_Coordinates(data->ref_obj, a, b, owner, a, b);
    if (data->as_line)
      Am_Translate_Coordinates(data->ref_obj, c, d, owner, c, d);
  }
  Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING,
                              "++Object setting obj position=" << object);
  if (data->as_line) {
    if (data->a_control == Am_LOCATION_RELATIVE)
      a = (int)object.Get(Am_X1) + data->data.line.x1;
    if (data->b_control == Am_LOCATION_RELATIVE)
      b = (int)object.Get(Am_Y1) + data->data.line.y1;
    if (data->c_control == Am_LOCATION_RELATIVE)
      c = (int)object.Get(Am_X2) + data->data.line.x2;
    if (data->d_control == Am_LOCATION_RELATIVE)
      d = (int)object.Get(Am_Y2) + data->data.line.y2;

    if (data->a_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " X1=" << a);
      object.Set(Am_X1, a); // , Am_NO_ANIMATION
    }
    if (data->b_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " Y1=" << b);
      object.Set(Am_Y1, b); // , Am_NO_ANIMATION
    }
    if (data->c_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " X2=" << c);
      object.Set(Am_X2, c); // , Am_NO_ANIMATION
    }
    if (data->d_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " Y2=" << d);
      object.Set(Am_Y2, d); // , Am_NO_ANIMATION
    }
  } else {
    if (data->a_control == Am_LOCATION_RELATIVE)
      a = (int)object.Get(Am_LEFT) + data->data.rect.left;
    if (data->b_control == Am_LOCATION_RELATIVE)
      b = (int)object.Get(Am_TOP) + data->data.rect.top;

    if (data->a_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " left=" << a);
      object.Set(Am_LEFT, a); // , Am_NO_ANIMATION
    }
    if (data->b_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " top=" << b);
      object.Set(Am_TOP, b); // , Am_NO_ANIMATION
    }
    if (growing) {
      if (data->c_control == Am_LOCATION_RELATIVE)
        c = (int)object.Get(Am_WIDTH) + data->data.rect.width;
      if (data->d_control == Am_LOCATION_RELATIVE)
        d = (int)object.Get(Am_HEIGHT) + data->data.rect.height;

      if (data->c_control != Am_LOCATION_NOT_USED) {
        Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " width=" << c);
        object.Set(Am_WIDTH, c); // , Am_NO_ANIMATION
      }
      if (data->d_control != Am_LOCATION_NOT_USED) {
        Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " height=" << d);
        object.Set(Am_HEIGHT, d); // , Am_NO_ANIMATION
      }
    }
  }
  Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, std::endl << std::flush);
}